

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

_Bool swap_commutative(TCGArg dest,TCGArg *p1,TCGArg *p2)

{
  TCGArg arg;
  TCGArg arg_00;
  _Bool _Var1;
  _Bool _Var2;
  int sum;
  TCGArg a2;
  TCGArg a1;
  TCGArg *p2_local;
  TCGArg *p1_local;
  TCGArg dest_local;
  
  arg = *p1;
  arg_00 = *p2;
  _Var1 = arg_is_const(arg);
  _Var2 = arg_is_const(arg_00);
  if (((int)((uint)_Var1 - (uint)_Var2) < 1) && (((uint)_Var1 != (uint)_Var2 || (dest != arg_00))))
  {
    dest_local._7_1_ = false;
  }
  else {
    *p1 = arg_00;
    *p2 = arg;
    dest_local._7_1_ = true;
  }
  return dest_local._7_1_;
}

Assistant:

static bool swap_commutative(TCGArg dest, TCGArg *p1, TCGArg *p2)
{
    TCGArg a1 = *p1, a2 = *p2;
    int sum = 0;
    sum += arg_is_const(a1);
    sum -= arg_is_const(a2);

    /* Prefer the constant in second argument, and then the form
       op a, a, b, which is better handled on non-RISC hosts. */
    if (sum > 0 || (sum == 0 && dest == a2)) {
        *p1 = a2;
        *p2 = a1;
        return true;
    }
    return false;
}